

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

PLYValue * __thiscall gvr::PLYWriter::nextValue(PLYWriter *this)

{
  int iVar1;
  long lVar2;
  pointer ppPVar3;
  PLYElement *pPVar4;
  pointer pPVar5;
  IOException *this_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  allocator local_39;
  string local_38;
  
  iVar1 = this->plist;
  this->plist = iVar1 + -1;
  if (iVar1 < 1) {
    iVar1 = this->pprop;
    this->pprop = iVar1 + -1;
    if (iVar1 < 2) {
      lVar2 = this->pinst;
      this->pinst = lVar2 + -1;
      if (lVar2 < 2) {
        this->element = (PLYElement *)0x0;
        ppPVar3 = (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = (long)(this->list).
                      super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3;
        uVar7 = this->pelem + 1;
        uVar8 = uVar7;
        if (uVar7 < uVar6) {
          uVar8 = uVar6;
        }
        while( true ) {
          if (uVar6 <= uVar7) {
            this->pelem = uVar8;
            std::ostream::flush();
            this_00 = (IOException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_38,
                       "Attempt to write more data than specified in the PLY header",&local_39);
            gutil::IOException::IOException(this_00,&local_38);
            __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
          }
          pPVar4 = ppPVar3[uVar7];
          lVar2 = pPVar4->size;
          if ((0 < lVar2) &&
             (uVar9 = (long)(pPVar4->list).
                            super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar4->list).
                            super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                            ._M_impl.super__Vector_impl_data._M_start, (int)(uVar9 >> 6) != 0))
          break;
          uVar7 = uVar7 + 1;
        }
        this->pelem = uVar7;
        this->element = pPVar4;
        this->pinst = lVar2;
      }
      else {
        uVar9 = (long)(this->element->list).
                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->element->list).
                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
      this->pprop = (int)(uVar9 >> 6);
      if (this->enc == ply_ascii) {
        std::endl<char,std::char_traits<char>>((ostream *)&this->out);
      }
    }
    this->plist = 0;
  }
  pPVar5 = (this->element->list).
           super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return pPVar5[(long)(int)((ulong)((long)(this->element->list).
                                          super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5)
                           >> 6) - (long)this->pprop].value;
}

Assistant:

PLYValue &PLYWriter::nextValue()
{
  // increment internal pointers to the next (list) value, instance or
  // element, according to the specified header

  plist--;

  if (plist < 0)
  {
    pprop--;

    if (pprop <= 0)
    {
      pinst--;

      if (pinst <= 0)
      {
        element=0;

        pelem++;

        while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                       list[pelem]->getPropertyCount() == 0))
        {
          pelem++;
        }

        if (pelem >= list.size())
        {
          out.flush();
          throw gutil::IOException("Attempt to write more data than specified in the PLY header");
        }

        element=list[pelem];
        pinst=element->getInstances();
      }

      pprop=element->getPropertyCount();

      if (enc == ply_ascii)
      {
        out << std::endl;
      }
    }

    plist=0;
  }

  return element->getProperty(element->getPropertyCount()-pprop).getValue();
}